

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O3

bool __thiscall cinatra::coro_http_request::is_upgrade(coro_http_request *this)

{
  string_view key;
  string_view sVar1;
  
  if (this->parser_->has_upgrade_ == true) {
    sVar1._M_str = "Upgrade";
    sVar1._M_len = 7;
    sVar1 = get_header_value(this,sVar1);
    if (((sVar1._M_len == 9) &&
        ((char)*(long *)((long)sVar1._M_str + 8) == 't' &&
         *(long *)sVar1._M_str == 0x656b636f73626577)) &&
       (key._M_str = "sec-websocket-key", key._M_len = 0x11, sVar1 = get_header_value(this,key),
       sVar1._M_len == 0x18)) {
      this->is_websocket_ = true;
      return true;
    }
  }
  return false;
}

Assistant:

bool is_upgrade() {
    if (!parser_.has_upgrade())
      return false;

    auto u = get_header_value("Upgrade");
    if (u.empty())
      return false;

    if (u != WEBSOCKET)
      return false;

    auto sec_ws_key = get_header_value("sec-websocket-key");
    if (sec_ws_key.empty() || sec_ws_key.size() != 24)
      return false;

    is_websocket_ = true;
    return true;
  }